

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void write_fp_dreg_aarch64(DisasContext_conflict1 *s,int reg,TCGv_i64 v)

{
  TCGContext_conflict1 *tcg_ctx_00;
  uint uVar1;
  uint ofs;
  TCGContext_conflict1 *tcg_ctx;
  TCGv_i64 v_local;
  int reg_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  uVar1 = fp_reg_offset(s,reg,MO_64);
  tcg_gen_st_i64_aarch64(tcg_ctx_00,v,tcg_ctx_00->cpu_env,(ulong)uVar1);
  clear_vec_high(s,false,reg);
  return;
}

Assistant:

void write_fp_dreg(DisasContext *s, int reg, TCGv_i64 v)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    unsigned ofs = fp_reg_offset(s, reg, MO_64);

    tcg_gen_st_i64(tcg_ctx, v, tcg_ctx->cpu_env, ofs);
    clear_vec_high(s, false, reg);
}